

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void google::protobuf::EnumValueOptions::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  HasBits<1> *pHVar1;
  uint uVar2;
  MessageLite *pMVar3;
  MessageLite *pMVar4;
  char *failure_msg;
  void *pvVar5;
  int line;
  Arena *arena;
  EnumValueOptions *_this;
  EnumValueOptions *local_30;
  MessageLite *local_28 [2];
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  local_30 = (EnumValueOptions *)to_msg;
  local_28[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<google::protobuf::EnumValueOptions_const*,google::protobuf::EnumValueOptions*>
                          ((EnumValueOptions **)local_28,&local_30,"&from != _this");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    line = 0x2d4f;
LAB_00311e2e:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
               ,line,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28)
    ;
  }
  RepeatedPtrField<google::protobuf::UninterpretedOption>::MergeFrom
            (&(local_30->field_0)._impl_.uninterpreted_option_,
             (RepeatedPtrField<google::protobuf::UninterpretedOption> *)(from_msg + 3));
  uVar2 = (uint)from_msg[2]._internal_metadata_.ptr_;
  if ((uVar2 & 0xf) != 0) {
    if ((uVar2 & 1) != 0) {
      pMVar3 = (MessageLite *)from_msg[4]._internal_metadata_.ptr_;
      if (pMVar3 == (MessageLite *)0x0) {
        failure_msg = "from._impl_.features_ != nullptr";
        line = 0x2d58;
        goto LAB_00311e2e;
      }
      pMVar4 = *(MessageLite **)((long)&local_30->field_0 + 0x38);
      if (pMVar4 == (MessageLite *)0x0) {
        pvVar5 = Arena::CopyConstruct<google::protobuf::FeatureSet>(arena,pMVar3);
        *(void **)((long)&local_30->field_0 + 0x38) = pvVar5;
      }
      else {
        FeatureSet::MergeImpl(pMVar4,pMVar3);
      }
    }
    if ((uVar2 & 2) != 0) {
      pMVar3 = (MessageLite *)from_msg[5]._vptr_MessageLite;
      if (pMVar3 == (MessageLite *)0x0) {
        failure_msg = "from._impl_.feature_support_ != nullptr";
        line = 0x2d60;
        goto LAB_00311e2e;
      }
      pMVar4 = *(MessageLite **)((long)&local_30->field_0 + 0x40);
      if (pMVar4 == (MessageLite *)0x0) {
        pvVar5 = Arena::CopyConstruct<google::protobuf::FieldOptions_FeatureSupport>(arena,pMVar3);
        *(void **)((long)&local_30->field_0 + 0x40) = pvVar5;
      }
      else {
        FieldOptions_FeatureSupport::MergeImpl(pMVar4,pMVar3);
      }
    }
    if ((uVar2 & 4) != 0) {
      *(char *)((long)&local_30->field_0 + 0x48) = (char)from_msg[5]._internal_metadata_.ptr_;
    }
    if ((uVar2 & 8) != 0) {
      (local_30->field_0)._impl_.debug_redact_ =
           *(bool *)((long)&from_msg[5]._internal_metadata_.ptr_ + 1);
    }
  }
  pHVar1 = &(local_30->field_0)._impl_._has_bits_;
  pHVar1->has_bits_[0] = pHVar1->has_bits_[0] | uVar2;
  internal::ExtensionSet::MergeFrom
            (&(local_30->field_0)._impl_._extensions_,
             (MessageLite *)_EnumValueOptions_default_instance_,(ExtensionSet *)(from_msg + 1));
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(local_30->super_Message).super_MessageLite._internal_metadata_,
             &from_msg->_internal_metadata_);
  return;
}

Assistant:

void EnumValueOptions::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<EnumValueOptions*>(&to_msg);
  auto& from = static_cast<const EnumValueOptions&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.EnumValueOptions)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_uninterpreted_option()->MergeFrom(
      from._internal_uninterpreted_option());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(from._impl_.features_ != nullptr);
      if (_this->_impl_.features_ == nullptr) {
        _this->_impl_.features_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.features_);
      } else {
        _this->_impl_.features_->MergeFrom(*from._impl_.features_);
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.feature_support_ != nullptr);
      if (_this->_impl_.feature_support_ == nullptr) {
        _this->_impl_.feature_support_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.feature_support_);
      } else {
        _this->_impl_.feature_support_->MergeFrom(*from._impl_.feature_support_);
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.deprecated_ = from._impl_.deprecated_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.debug_redact_ = from._impl_.debug_redact_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_impl_._extensions_.MergeFrom(&default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}